

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::DecodeChunk
              (EXRImage *exr_image,EXRHeader *exr_header,OffsetData *offset_data,uchar *head,
              size_t size,string *err)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  void *pvVar5;
  const_reference this;
  uchar **ppuVar6;
  const_reference pvVar7;
  int *piVar8;
  long lVar9;
  long in_RCX;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *in_RDX;
  long in_RSI;
  long in_RDI;
  ulong in_R8;
  string *in_R9;
  int c;
  tinyexr_int64 lno;
  int num_lines;
  int end_line_no;
  int data_len;
  int line_no;
  uchar *data_ptr;
  size_t data_size;
  size_t y_idx;
  int y;
  stringstream ss_4;
  bool total_data_len_overflown;
  size_t total_data_len;
  int ret_1;
  int level_x;
  int level_y;
  EXRImage *level_image_1;
  int ret;
  int level;
  EXRImage *level_image;
  stringstream ss_3;
  stringstream ss_2;
  bool invalid_data;
  size_t channel_offset;
  int pixel_data_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channel_offset_list;
  size_t num_blocks;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *offsets;
  stringstream ss_1;
  stringstream ss;
  int data_height;
  int data_width;
  int num_scanline_blocks;
  int num_channels;
  ulong in_stack_fffffffffffff4e8;
  int iVar10;
  string *in_stack_fffffffffffff4f0;
  int in_stack_fffffffffffff4f8;
  int in_stack_fffffffffffff4fc;
  int in_stack_fffffffffffff500;
  int in_stack_fffffffffffff504;
  undefined4 in_stack_fffffffffffff508;
  undefined4 in_stack_fffffffffffff50c;
  undefined4 in_stack_fffffffffffff510;
  int in_stack_fffffffffffff514;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff518;
  undefined4 in_stack_fffffffffffff5d8;
  undefined4 in_stack_fffffffffffff5dc;
  void *in_stack_fffffffffffff5e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff5e8;
  OffsetData *in_stack_fffffffffffff5f0;
  EXRHeader *in_stack_fffffffffffff5f8;
  EXRImage *in_stack_fffffffffffff600;
  size_t in_stack_fffffffffffff640;
  string *in_stack_fffffffffffff648;
  int local_98c;
  int local_97c;
  int local_978;
  int local_974;
  int local_970;
  int local_96c;
  int *local_968;
  ulong local_960;
  size_type local_958;
  int local_94c;
  string local_948 [32];
  stringstream local_928 [16];
  ostream local_918 [383];
  undefined1 local_799;
  ulong local_798;
  int local_78c;
  int local_788;
  int local_784;
  long local_780;
  int local_778;
  int local_774;
  long local_770;
  string local_768 [32];
  stringstream local_748 [16];
  int in_stack_fffffffffffff8c8;
  int in_stack_fffffffffffff8cc;
  size_t in_stack_fffffffffffff8d0;
  uchar *in_stack_fffffffffffff8d8;
  int *in_stack_fffffffffffff8e0;
  uchar **in_stack_fffffffffffff8e8;
  int in_stack_fffffffffffff900;
  int in_stack_fffffffffffff908;
  int in_stack_fffffffffffff910;
  int in_stack_fffffffffffff918;
  int in_stack_fffffffffffff920;
  int in_stack_fffffffffffff928;
  size_t in_stack_fffffffffffff930;
  size_t in_stack_fffffffffffff938;
  EXRAttribute *in_stack_fffffffffffff940;
  size_t in_stack_fffffffffffff948;
  EXRChannelInfo *in_stack_fffffffffffff950;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffff958;
  string local_5c0 [32];
  stringstream local_5a0 [16];
  ostream local_590 [379];
  byte local_415;
  undefined4 local_414;
  undefined8 local_410;
  undefined4 local_404;
  size_type local_3e8;
  const_reference local_3e0;
  string local_3d8 [32];
  stringstream local_3b8 [16];
  ostream local_3a8 [376];
  string local_230 [48];
  stringstream local_200 [16];
  ostream local_1f0 [376];
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  string *local_68;
  ulong local_60;
  long local_58;
  vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *local_50;
  long local_48;
  long local_40;
  int local_34;
  
  local_6c = *(int *)(in_RSI + 0x78);
  local_70 = 1;
  if (*(int *)(in_RSI + 0x7c) == 3) {
    local_70 = 0x10;
  }
  else if (*(int *)(in_RSI + 0x7c) == 4) {
    local_70 = 0x20;
  }
  else if (*(int *)(in_RSI + 0x7c) == 0x80) {
    local_70 = 0x10;
  }
  if ((*(int *)(in_RSI + 0x10) < *(int *)(in_RSI + 8)) ||
     (*(int *)(in_RSI + 0x14) < *(int *)(in_RSI + 0xc))) {
    if (in_R9 != (string *)0x0) {
      std::__cxx11::string::operator+=(in_R9,"Invalid data window.\n");
    }
    return -4;
  }
  local_74 = (*(int *)(in_RSI + 0x10) - *(int *)(in_RSI + 8)) + 1;
  local_78 = (*(int *)(in_RSI + 0x14) - *(int *)(in_RSI + 0xc)) + 1;
  local_68 = in_R9;
  if ((0x800000 < local_74) || (0x800000 < local_78)) {
    if (in_R9 != (string *)0x0) {
      std::__cxx11::stringstream::stringstream(local_200);
      poVar4 = std::operator<<(local_1f0,"data_with or data_height too large. data_width: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_74);
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,"data_height = ");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,local_78);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator+=(local_68,local_230);
      std::__cxx11::string::~string(local_230);
      std::__cxx11::stringstream::~stringstream(local_200);
    }
    return -4;
  }
  local_48 = in_RSI;
  if ((*(int *)(in_RSI + 0x38) != 0) &&
     ((0x800000 < *(int *)(in_RSI + 0x3c) || (0x800000 < *(int *)(in_RSI + 0x40))))) {
    if (in_R9 != (string *)0x0) {
      std::__cxx11::stringstream::stringstream(local_3b8);
      poVar4 = std::operator<<(local_3a8,"tile with or tile height too large. tile width: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)(local_48 + 0x3c));
      poVar4 = std::operator<<(poVar4,", ");
      poVar4 = std::operator<<(poVar4,"tile height = ");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,*(int *)(local_48 + 0x40));
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator+=(local_68,local_3d8);
      std::__cxx11::string::~string(local_3d8);
      std::__cxx11::stringstream::~stringstream(local_3b8);
    }
    return -4;
  }
  local_60 = in_R8;
  local_58 = in_RCX;
  local_50 = in_RDX;
  local_40 = in_RDI;
  this = std::
         vector<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
         ::operator[](in_RDX,0);
  local_3e0 = std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::operator[](this,0);
  local_3e8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_3e0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4499f4);
  local_404 = 0;
  local_410 = 0;
  bVar2 = ComputeChannelLayout
                    (in_stack_fffffffffffff518,
                     (int *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                     (size_t *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                     in_stack_fffffffffffff504,
                     (EXRChannelInfo *)CONCAT44(in_stack_fffffffffffff4fc,in_stack_fffffffffffff4f8)
                    );
  if (!bVar2) {
    if (local_68 != (string *)0x0) {
      std::__cxx11::string::operator+=(local_68,"Failed to compute channel layout.\n");
    }
    local_34 = -4;
    goto LAB_0044a811;
  }
  local_415 = 0;
  if (*(int *)(local_48 + 0x38) == 0) {
    local_798 = (long)local_74 * (long)local_78 * (long)local_6c;
    local_799 = 0x3fffffffff < local_798;
    if ((local_798 == 0) || ((bool)local_799)) {
      if (local_68 != (string *)0x0) {
        std::__cxx11::stringstream::stringstream(local_928);
        poVar4 = std::operator<<(local_918,"Image data size is zero or too large: width = ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_74);
        poVar4 = std::operator<<(poVar4,", height = ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_78);
        poVar4 = std::operator<<(poVar4,", channels = ");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,local_6c);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator+=(local_68,local_948);
        std::__cxx11::string::~string(local_948);
        std::__cxx11::stringstream::~stringstream(local_928);
      }
      local_34 = -4;
      goto LAB_0044a811;
    }
    ppuVar6 = AllocateImage(in_stack_fffffffffffff514,
                            (EXRChannelInfo *)
                            CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508),
                            (int *)CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500),
                            in_stack_fffffffffffff4fc,in_stack_fffffffffffff4f8);
    *(uchar ***)(local_40 + 0x18) = ppuVar6;
    for (local_94c = 0; local_94c < (int)local_3e8; local_94c = local_94c + 1) {
      local_958 = (size_type)local_94c;
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_3e0,local_958);
      uVar1 = local_60;
      if (local_60 < *pvVar7 + 8) {
        local_415 = 1;
      }
      else {
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (local_3e0,local_958);
        lVar9 = local_58;
        local_960 = uVar1 - (*pvVar7 + 8);
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (local_3e0,local_958);
        local_968 = (int *)(lVar9 + *pvVar7);
        local_96c = *local_968;
        local_970 = local_968[1];
        swap4(&local_96c);
        swap4(&local_970);
        if (local_960 < (ulong)(long)local_970) {
          local_415 = 1;
        }
        else if ((local_96c < 0x200001) && (-0x200001 < local_96c)) {
          if (local_970 == 0) {
            local_415 = 1;
          }
          else {
            local_978 = local_96c + local_70;
            local_97c = *(int *)(local_48 + 0x14) + 1;
            piVar8 = std::min<int>(&local_978,&local_97c);
            local_974 = *piVar8;
            if (local_974 - local_96c < 1) {
              local_415 = 1;
            }
            else {
              local_968 = local_968 + 2;
              lVar9 = (long)local_96c - (long)*(int *)(local_48 + 0xc);
              iVar3 = std::numeric_limits<int>::max();
              if (iVar3 < lVar9) {
                local_96c = -1;
              }
              else {
                iVar3 = std::numeric_limits<int>::max();
                if (lVar9 < -iVar3) {
                  local_96c = -1;
                }
                else {
                  local_96c = local_96c - *(int *)(local_48 + 0xc);
                }
              }
              if (local_96c < 0) {
                local_415 = 1;
              }
              else {
                in_stack_fffffffffffff500 = local_94c;
                bVar2 = DecodePixelData(in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
                                        in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,
                                        in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8,
                                        in_stack_fffffffffffff900,in_stack_fffffffffffff908,
                                        in_stack_fffffffffffff910,in_stack_fffffffffffff918,
                                        in_stack_fffffffffffff920,in_stack_fffffffffffff928,
                                        in_stack_fffffffffffff930,in_stack_fffffffffffff938,
                                        in_stack_fffffffffffff940,in_stack_fffffffffffff948,
                                        in_stack_fffffffffffff950,in_stack_fffffffffffff958);
                if (!bVar2) {
                  local_415 = 1;
                }
              }
            }
          }
        }
        else {
          local_415 = 1;
        }
      }
    }
  }
  else {
    if (*(int *)(local_48 + 0x3c) < 0) {
      if (local_68 != (string *)0x0) {
        std::__cxx11::stringstream::stringstream(local_5a0);
        poVar4 = std::operator<<(local_590,"Invalid tile size x : ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)(local_48 + 0x3c));
        std::operator<<(poVar4,"\n");
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator+=(local_68,local_5c0);
        std::__cxx11::string::~string(local_5c0);
        std::__cxx11::stringstream::~stringstream(local_5a0);
      }
      local_34 = -9;
      goto LAB_0044a811;
    }
    if (*(int *)(local_48 + 0x40) < 0) {
      if (local_68 != (string *)0x0) {
        std::__cxx11::stringstream::stringstream(local_748);
        poVar4 = std::operator<<((ostream *)&stack0xfffffffffffff8c8,"Invalid tile size y : ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)(local_48 + 0x40));
        std::operator<<(poVar4,"\n");
        std::__cxx11::stringstream::str();
        std::__cxx11::string::operator+=(local_68,local_768);
        std::__cxx11::string::~string(local_768);
        std::__cxx11::stringstream::~stringstream(local_748);
      }
      local_34 = -9;
      goto LAB_0044a811;
    }
    if (*(int *)(local_48 + 0x44) == 2) {
      local_780 = 0;
      for (local_784 = 0;
          local_784 <
          *(int *)((long)&local_50[1].
                          super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4); local_784 = local_784 + 1)
      {
        for (local_788 = 0;
            local_788 <
            *(int *)&local_50[1].
                     super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; local_788 = local_788 + 1) {
          if (local_780 == 0) {
            local_780 = local_40;
          }
          else {
            pvVar5 = ::operator_new(0x30);
            *(void **)(local_780 + 8) = pvVar5;
            InitEXRImage(*(EXRImage **)(local_780 + 8));
            local_780 = *(long *)(local_780 + 8);
          }
          iVar10 = (int)(in_stack_fffffffffffff4e8 >> 0x20);
          iVar3 = LevelSize((int)((ulong)in_stack_fffffffffffff4f0 >> 0x20),
                            (int)in_stack_fffffffffffff4f0,iVar10);
          *(int *)(local_780 + 0x20) = iVar3;
          iVar3 = LevelSize((int)((ulong)in_stack_fffffffffffff4f0 >> 0x20),
                            (int)in_stack_fffffffffffff4f0,iVar10);
          in_stack_fffffffffffff4e8 = local_60;
          *(int *)(local_780 + 0x24) = iVar3;
          *(int *)(local_780 + 0x10) = local_788;
          *(int *)(local_780 + 0x14) = local_784;
          in_stack_fffffffffffff4f0 = local_68;
          local_78c = DecodeTiledLevel(in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
                                       in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                                       (int)((ulong)in_stack_fffffffffffff5e0 >> 0x20),
                                       (uchar *)CONCAT44(in_stack_fffffffffffff5dc,
                                                         in_stack_fffffffffffff5d8),
                                       in_stack_fffffffffffff640,in_stack_fffffffffffff648);
          local_34 = local_78c;
          if (local_78c != 0) goto LAB_0044a811;
        }
      }
    }
    else {
      local_770 = 0;
      for (local_774 = 0;
          local_774 <
          *(int *)&local_50[1].
                   super__Vector_base<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; local_774 = local_774 + 1) {
        if (local_770 == 0) {
          local_770 = local_40;
        }
        else {
          in_stack_fffffffffffff5e0 = ::operator_new(0x30);
          *(void **)(local_770 + 8) = in_stack_fffffffffffff5e0;
          InitEXRImage(*(EXRImage **)(local_770 + 8));
          local_770 = *(long *)(local_770 + 8);
        }
        iVar10 = (int)(in_stack_fffffffffffff4e8 >> 0x20);
        iVar3 = LevelSize((int)((ulong)in_stack_fffffffffffff4f0 >> 0x20),
                          (int)in_stack_fffffffffffff4f0,iVar10);
        *(int *)(local_770 + 0x20) = iVar3;
        iVar3 = LevelSize((int)((ulong)in_stack_fffffffffffff4f0 >> 0x20),
                          (int)in_stack_fffffffffffff4f0,iVar10);
        in_stack_fffffffffffff4e8 = local_60;
        *(int *)(local_770 + 0x24) = iVar3;
        *(int *)(local_770 + 0x10) = local_774;
        *(int *)(local_770 + 0x14) = local_774;
        in_stack_fffffffffffff4f0 = local_68;
        local_778 = DecodeTiledLevel(in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,
                                     in_stack_fffffffffffff5f0,in_stack_fffffffffffff5e8,
                                     (int)((ulong)in_stack_fffffffffffff5e0 >> 0x20),
                                     (uchar *)CONCAT44(in_stack_fffffffffffff5dc,
                                                       in_stack_fffffffffffff5d8),
                                     in_stack_fffffffffffff640,in_stack_fffffffffffff648);
        local_34 = local_778;
        if (local_778 != 0) goto LAB_0044a811;
        in_stack_fffffffffffff5dc = 0;
      }
    }
  }
  if ((local_415 & 1) == 0) {
    for (local_98c = 0; local_98c < *(int *)(local_48 + 0x78); local_98c = local_98c + 1) {
      *(undefined4 *)(*(long *)(local_48 + 0x70) + (long)local_98c * 4) =
           *(undefined4 *)(*(long *)(local_48 + 0x80) + (long)local_98c * 4);
    }
    *(int *)(local_40 + 0x28) = local_6c;
    *(int *)(local_40 + 0x20) = local_74;
    *(int *)(local_40 + 0x24) = local_78;
    local_34 = 0;
  }
  else {
    if (local_68 != (string *)0x0) {
      std::__cxx11::string::operator+=(local_68,"Invalid data found when decoding pixels.\n");
    }
    local_34 = -4;
  }
LAB_0044a811:
  local_414 = 1;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffff504,in_stack_fffffffffffff500));
  return local_34;
}

Assistant:

static int DecodeChunk(EXRImage *exr_image, const EXRHeader *exr_header,
                       const OffsetData& offset_data,
                       const unsigned char *head, const size_t size,
                       std::string *err) {
  int num_channels = exr_header->num_channels;

  int num_scanline_blocks = 1;
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZIP) {
    num_scanline_blocks = 16;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    num_scanline_blocks = 32;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    num_scanline_blocks = 16;

#if TINYEXR_USE_ZFP
    tinyexr::ZFPCompressionParam zfp_compression_param;
    if (!FindZFPCompressionParam(&zfp_compression_param,
                                 exr_header->custom_attributes,
                                 int(exr_header->num_custom_attributes), err)) {
      return TINYEXR_ERROR_INVALID_HEADER;
    }
#endif
  }

  if (exr_header->data_window.max_x < exr_header->data_window.min_x ||
      exr_header->data_window.max_y < exr_header->data_window.min_y) {
    if (err) {
      (*err) += "Invalid data window.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  int data_width =
      exr_header->data_window.max_x - exr_header->data_window.min_x + 1;
  int data_height =
      exr_header->data_window.max_y - exr_header->data_window.min_y + 1;

  // Do not allow too large data_width and data_height. header invalid?
  {
    if ((data_width > TINYEXR_DIMENSION_THRESHOLD) || (data_height > TINYEXR_DIMENSION_THRESHOLD)) {
      if (err) {
        std::stringstream ss;
        ss << "data_with or data_height too large. data_width: " << data_width
           << ", "
           << "data_height = " << data_height << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }
    if (exr_header->tiled) {
      if ((exr_header->tile_size_x > TINYEXR_DIMENSION_THRESHOLD) || (exr_header->tile_size_y > TINYEXR_DIMENSION_THRESHOLD)) {
        if (err) {
          std::stringstream ss;
          ss << "tile with or tile height too large. tile width: " << exr_header->tile_size_x
            << ", "
            << "tile height = " << exr_header->tile_size_y << std::endl;
          (*err) += ss.str();
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }
    }
  }

  const std::vector<tinyexr::tinyexr_uint64>& offsets = offset_data.offsets[0][0];
  size_t num_blocks = offsets.size();

  std::vector<size_t> channel_offset_list;
  int pixel_data_size = 0;
  size_t channel_offset = 0;
  if (!tinyexr::ComputeChannelLayout(&channel_offset_list, &pixel_data_size,
                                     &channel_offset, num_channels,
                                     exr_header->channels)) {
    if (err) {
      (*err) += "Failed to compute channel layout.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
  std::atomic<bool> invalid_data(false);
#else
  bool invalid_data(false);
#endif

  if (exr_header->tiled) {
    // value check
    if (exr_header->tile_size_x < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size x : " << exr_header->tile_size_x << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }

    if (exr_header->tile_size_y < 0) {
      if (err) {
        std::stringstream ss;
        ss << "Invalid tile size y : " << exr_header->tile_size_y << "\n";
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }
    if (exr_header->tile_level_mode != TINYEXR_TILE_RIPMAP_LEVELS) {
      EXRImage* level_image = NULL;
      for (int level = 0; level < offset_data.num_x_levels; ++level) {
        if (!level_image) {
          level_image = exr_image;
        } else {
          level_image->next_level = new EXRImage;
          InitEXRImage(level_image->next_level);
          level_image = level_image->next_level;
        }
        level_image->width =
          LevelSize(exr_header->data_window.max_x - exr_header->data_window.min_x + 1, level, exr_header->tile_rounding_mode);
        level_image->height =
          LevelSize(exr_header->data_window.max_y - exr_header->data_window.min_y + 1, level, exr_header->tile_rounding_mode);
        level_image->level_x = level;
        level_image->level_y = level;

        int ret = DecodeTiledLevel(level_image, exr_header,
          offset_data,
          channel_offset_list,
          pixel_data_size,
          head, size,
          err);
        if (ret != TINYEXR_SUCCESS) return ret;
      }
    } else {
      EXRImage* level_image = NULL;
      for (int level_y = 0; level_y < offset_data.num_y_levels; ++level_y)
        for (int level_x = 0; level_x < offset_data.num_x_levels; ++level_x) {
          if (!level_image) {
            level_image = exr_image;
          } else {
            level_image->next_level = new EXRImage;
            InitEXRImage(level_image->next_level);
            level_image = level_image->next_level;
          }

          level_image->width =
            LevelSize(exr_header->data_window.max_x - exr_header->data_window.min_x + 1, level_x, exr_header->tile_rounding_mode);
          level_image->height =
            LevelSize(exr_header->data_window.max_y - exr_header->data_window.min_y + 1, level_y, exr_header->tile_rounding_mode);
          level_image->level_x = level_x;
          level_image->level_y = level_y;

          int ret = DecodeTiledLevel(level_image, exr_header,
            offset_data,
            channel_offset_list,
            pixel_data_size,
            head, size,
            err);
          if (ret != TINYEXR_SUCCESS) return ret;
        }
    }
  } else {  // scanline format
    // Don't allow too large image(256GB * pixel_data_size or more). Workaround
    // for #104.
    size_t total_data_len =
        size_t(data_width) * size_t(data_height) * size_t(num_channels);
    const bool total_data_len_overflown =
        sizeof(void *) == 8 ? (total_data_len >= 0x4000000000) : false;
    if ((total_data_len == 0) || total_data_len_overflown) {
      if (err) {
        std::stringstream ss;
        ss << "Image data size is zero or too large: width = " << data_width
           << ", height = " << data_height << ", channels = " << num_channels
           << std::endl;
        (*err) += ss.str();
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    exr_image->images = tinyexr::AllocateImage(
        num_channels, exr_header->channels, exr_header->requested_pixel_types,
        data_width, data_height);

#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
    std::vector<std::thread> workers;
    std::atomic<int> y_count(0);

    int num_threads = std::max(1, int(std::thread::hardware_concurrency()));
    if (num_threads > int(num_blocks)) {
      num_threads = int(num_blocks);
    }

    for (int t = 0; t < num_threads; t++) {
      workers.emplace_back(std::thread([&]() {
        int y = 0;
        while ((y = y_count++) < int(num_blocks)) {

#else

#if TINYEXR_USE_OPENMP
#pragma omp parallel for
#endif
    for (int y = 0; y < static_cast<int>(num_blocks); y++) {

#endif
          size_t y_idx = static_cast<size_t>(y);

          if (offsets[y_idx] + sizeof(int) * 2 > size) {
            invalid_data = true;
          } else {
            // 4 byte: scan line
            // 4 byte: data size
            // ~     : pixel data(uncompressed or compressed)
            size_t data_size =
                size_t(size - (offsets[y_idx] + sizeof(int) * 2));
            const unsigned char *data_ptr =
                reinterpret_cast<const unsigned char *>(head + offsets[y_idx]);

            int line_no;
            memcpy(&line_no, data_ptr, sizeof(int));
            int data_len;
            memcpy(&data_len, data_ptr + 4, sizeof(int));
            tinyexr::swap4(&line_no);
            tinyexr::swap4(&data_len);

            if (size_t(data_len) > data_size) {
              invalid_data = true;

            } else if ((line_no > (2 << 20)) || (line_no < -(2 << 20))) {
              // Too large value. Assume this is invalid
              // 2**20 = 1048576 = heuristic value.
              invalid_data = true;
            } else if (data_len == 0) {
              // TODO(syoyo): May be ok to raise the threshold for example
              // `data_len < 4`
              invalid_data = true;
            } else {
              // line_no may be negative.
              int end_line_no = (std::min)(line_no + num_scanline_blocks,
                                           (exr_header->data_window.max_y + 1));

              int num_lines = end_line_no - line_no;

              if (num_lines <= 0) {
                invalid_data = true;
              } else {
                // Move to data addr: 8 = 4 + 4;
                data_ptr += 8;

                // Adjust line_no with data_window.bmin.y

                // overflow check
                tinyexr_int64 lno =
                    static_cast<tinyexr_int64>(line_no) -
                    static_cast<tinyexr_int64>(exr_header->data_window.min_y);
                if (lno > std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else if (lno < -std::numeric_limits<int>::max()) {
                  line_no = -1;  // invalid
                } else {
                  line_no -= exr_header->data_window.min_y;
                }

                if (line_no < 0) {
                  invalid_data = true;
                } else {
                  if (!tinyexr::DecodePixelData(
                          exr_image->images, exr_header->requested_pixel_types,
                          data_ptr, static_cast<size_t>(data_len),
                          exr_header->compression_type, exr_header->line_order,
                          data_width, data_height, data_width, y, line_no,
                          num_lines, static_cast<size_t>(pixel_data_size),
                          static_cast<size_t>(
                              exr_header->num_custom_attributes),
                          exr_header->custom_attributes,
                          static_cast<size_t>(exr_header->num_channels),
                          exr_header->channels, channel_offset_list)) {
                    invalid_data = true;
                  }
                }
              }
            }
          }

#if TINYEXR_HAS_CXX11 && (TINYEXR_USE_THREAD > 0)
        }
      }));
    }

    for (auto &t : workers) {
      t.join();
    }
#else
    }  // omp parallel
#endif
  }

  if (invalid_data) {
    if (err) {
      (*err) += "Invalid data found when decoding pixels.\n";
    }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  // Overwrite `pixel_type` with `requested_pixel_type`.
  {
    for (int c = 0; c < exr_header->num_channels; c++) {
      exr_header->pixel_types[c] = exr_header->requested_pixel_types[c];
    }
  }

  {
    exr_image->num_channels = num_channels;

    exr_image->width = data_width;
    exr_image->height = data_height;
  }

  return TINYEXR_SUCCESS;
}